

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall
CUI::DoScrollbarOptionLabeled
          (CUI *this,void *pID,int *pOption,CUIRect *pRect,char *pStr,char **aLabels,int NumLabels,
          IScrollbarScale *pScale)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  float Current;
  CUIRect ScrollBar;
  CUIRect Label;
  char aBuf [128];
  CUIRect local_d8;
  vec4 local_c8;
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *pOption;
  uVar5 = NumLabels - 1;
  uVar4 = uVar5;
  if ((int)uVar3 < (int)uVar5) {
    uVar4 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar4 = 0;
  }
  str_format(local_b8,0x80,"%s: %s",pStr,aLabels[(int)uVar4]);
  fVar1 = pRect->h;
  local_c8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_c8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_c8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_c8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  CUIRect::Draw(pRect,&local_c8,5.0,0xf);
  CUIRect::VSplitLeft(pRect,pRect->h + 5.0,(CUIRect *)0x0,(CUIRect *)&local_c8);
  CUIRect::VSplitRight((CUIRect *)&local_c8,60.0,(CUIRect *)&local_c8,&local_d8);
  DoLabel(this,(CUIRect *)&local_c8,local_b8,fVar1 * 0.8 * 0.8,4,-1.0,true);
  CUIRect::VMargin(&local_d8,4.0,&local_d8);
  (**pScale->_vptr_IScrollbarScale)(pScale,(ulong)uVar4,0,(ulong)uVar5);
  DoScrollbarH(this,pID,&local_d8,Current);
  uVar3 = (*pScale->_vptr_IScrollbarScale[1])(pScale,0,(ulong)uVar5);
  if (this->m_pHotItem != pID) {
    if (this->m_pActiveItem == pID) {
      this->m_ActiveItemValid = true;
    }
    else {
      bVar2 = MouseHovered(this,pRect);
      if (((bVar2) && ((this->m_MouseButtons & 1) != 0)) && ((this->m_LastMouseButtons & 1) == 0)) {
        uVar3 = (int)(uVar3 + 1) % NumLabels;
      }
    }
  }
  if ((int)uVar3 < (int)uVar5) {
    uVar5 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar5 = 0;
  }
  *pOption = uVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoScrollbarOptionLabeled(const void *pID, int *pOption, const CUIRect *pRect, const char *pStr, const char* aLabels[], int NumLabels, const IScrollbarScale *pScale)
{
	int Value = clamp(*pOption, 0, NumLabels - 1);
	const int Max = NumLabels - 1;

	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "%s: %s", pStr, aLabels[Value]);

	float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;

	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, ScrollBar;
	pRect->VSplitLeft(pRect->h+5.0f, 0, &Label);
	Label.VSplitRight(60.0f, &Label, &ScrollBar);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_ML);

	ScrollBar.VMargin(4.0f, &ScrollBar);
	Value = pScale->ToAbsolute(DoScrollbarH(pID, &ScrollBar, pScale->ToRelative(Value, 0, Max)), 0, Max);

	if(HotItem() != pID && !CheckActiveItem(pID) && MouseHovered(pRect) && MouseButtonClicked(0))
		Value = (Value + 1) % NumLabels;

	*pOption = clamp(Value, 0, Max);
}